

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

bool __thiscall QDir::isEmpty(QDir *this,Filters filters)

{
  QDirPrivate *pQVar1;
  const_iterator cVar2;
  long in_FS_OFFSET;
  QDirListing dirList;
  QArrayDataPointer<char16_t> QStack_48;
  QDirListing local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d.ptr;
  local_30.d = (QDirListingPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::filePath((QString *)&QStack_48,&pQVar1->dirEntry);
  QDirListing::QDirListing
            (&local_30,(QString *)&QStack_48,&pQVar1->nameFilters,
             (uint)filters.super_QFlagsStorageHelper<QDir::Filter,_4>.
                   super_QFlagsStorage<QDir::Filter>.i,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  cVar2 = QDirListing::begin(&local_30);
  QDirListing::~QDirListing(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return cVar2.dirEntry.dirListPtr == (QDirListingPrivate *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::isEmpty(Filters filters) const
{
    Q_D(const QDir);
    QDirListing dirList(d->dirEntry.filePath(), d->nameFilters, filters.toInt());
    return dirList.cbegin() == dirList.cend();
}